

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

int Maj_ManExactSynthesis2
              (int nVars,int nNodes,int fUseConst,int fUseLine,int fUseRand,int nRands,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Maj_Man_t_conflict *p_00;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  int status;
  Maj_Man_t_conflict *p;
  abctime clkTotal;
  int iMint;
  int i;
  int nRands_local;
  int fUseRand_local;
  int fUseLine_local;
  int fUseConst_local;
  int nNodes_local;
  int nVars_local;
  
  clkTotal._0_4_ = 0;
  iMint = nRands;
  i = fUseRand;
  nRands_local = fUseLine;
  fUseRand_local = fUseConst;
  fUseLine_local = nNodes;
  fUseConst_local = nVars;
  aVar3 = Abc_Clock();
  p_00 = Maj_ManAlloc(fUseConst_local,fUseLine_local,fUseRand_local,nRands_local,i,iMint,fVerbose);
  iVar1 = Maj_ManAddCnfStart(p_00);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x1d4,"int Maj_ManExactSynthesis2(int, int, int, int, int, int, int)");
  }
  if (fVerbose != 0) {
    printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
           (ulong)(uint)p_00->nVars,(ulong)(uint)p_00->nNodes);
  }
  clkTotal._4_4_ = 0;
  do {
    if ((int)clkTotal == -1) {
LAB_007099b2:
      if ((int)clkTotal == -1) {
        Maj_ManPrintSolution(p_00);
      }
      Maj_ManFree(p_00);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Total runtime",aVar4 - aVar3);
      return (int)((int)clkTotal == -1);
    }
    aVar4 = Abc_Clock();
    iVar1 = Maj_ManAddCnf(p_00,(int)clkTotal);
    if (iVar1 == 0) {
      printf("The problem has no solution after %2d iterations.  ",(ulong)(clkTotal._4_4_ + 1));
      goto LAB_007099b2;
    }
    iVar1 = sat_solver_solve(p_00->pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (fVerbose != 0) {
      printf("Iter %3d : ",(ulong)clkTotal._4_4_);
      Extra_PrintBinary(_stdout,(uint *)&clkTotal,p_00->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p_00->iVar);
      uVar2 = sat_solver_nclauses(p_00->pSat);
      printf("Cla =%6d  ",(ulong)uVar2);
      uVar2 = sat_solver_nconflicts(p_00->pSat);
      printf("Conf =%9d  ",(ulong)uVar2);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    if (iVar1 == -1) {
      printf("The problem has no solution after %2d iterations.  ",(ulong)(clkTotal._4_4_ + 1));
      goto LAB_007099b2;
    }
    clkTotal._0_4_ = Maj_ManEval(p_00);
    clkTotal._4_4_ = clkTotal._4_4_ + 1;
  } while( true );
}

Assistant:

int Maj_ManExactSynthesis2( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine, fUseRand, nRands, fVerbose );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    if ( fVerbose )
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}